

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
               uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  double dVar1;
  reference pdVar2;
  ulong in_R8;
  byte in_R9B;
  size_t i_1;
  T tmp;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> r;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> l;
  size_t i;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  double dVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff78;
  ulong local_68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  double *local_48;
  double *local_40;
  ulong local_38;
  byte local_29;
  ulong local_28;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  if (local_29 == 0) {
    if (in_R8 != 0) {
      local_50 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
      local_58 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_50);
      dVar3 = *pdVar2;
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_58);
      dVar1 = *pdVar2;
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_50);
      *pdVar2 = dVar1;
      for (local_68 = 1; local_68 < local_28; local_68 = local_68 + 1) {
        local_50 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_50);
        in_stack_ffffffffffffff70._M_current = (double *)*pdVar2;
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_58);
        *pdVar2 = (double)in_stack_ffffffffffffff70._M_current;
        local_58 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_58);
        in_stack_ffffffffffffff78 =
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)*pdVar2;
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_50);
        *pdVar2 = (double)in_stack_ffffffffffffff78;
      }
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_58);
      *pdVar2 = dVar3;
    }
  }
  else {
    for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
      local_40 = (double *)
                 __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
      local_48 = (double *)
                 __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
      std::
      iter_swap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }